

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O3

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
::matches(Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          *this,candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                candidate)

{
  BinaryOp BVar1;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *pMVar2;
  Expression *curr;
  matched_t<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *ppEVar3;
  matched_t<wasm::Const_*> pCVar4;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *pMVar5;
  matched_t<wasm::Const_*> *ppCVar6;
  bool bVar7;
  BinaryOp BVar8;
  Literal local_38;
  
  if (candidate->_id == BinaryId) {
    if (this->binder !=
        (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> *
        )0x0) {
      *this->binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
            )candidate;
    }
    BVar1 = *(BinaryOp *)(candidate + 1);
    BVar8 = Abstract::getBinary((Type)*(uintptr_t *)(candidate[1].type.id + 8),this->data);
    if (BVar1 == BVar8) {
      pMVar2 = (this->submatchers).curr;
      curr = (Expression *)candidate[1].type.id;
      ppEVar3 = pMVar2->binder;
      if (ppEVar3 != (matched_t<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)0x0) {
        *ppEVar3 = curr;
      }
      bVar7 = MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>::operator()
                        ((MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)&local_38,
                         curr,pMVar2->data);
      if ((bVar7) &&
         (pCVar4 = *(matched_t<wasm::Const_*> *)(candidate + 2),
         (pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
         ConstId)) {
        pMVar5 = (this->submatchers).next.curr;
        ppCVar6 = pMVar5->binder;
        if (ppCVar6 != (matched_t<wasm::Const_*> *)0x0) {
          *ppCVar6 = pCVar4;
        }
        Literal::Literal(&local_38,&pCVar4->value);
        bVar7 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                ::matches(&(pMVar5->submatchers).curr,&local_38);
        Literal::~Literal(&local_38);
        return bVar7;
      }
    }
  }
  return false;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }